

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FloatStateQueryVerifiers::GetFloatVerifier::verifyFloat
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<float> state;
  undefined1 local_1a0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::verifyValidity
                    (&state,testCtx);
  if (bVar1) {
    if ((state.m_value != reference) || (NAN(state.m_value) || NAN(reference))) {
      local_1a0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: expected ");
      std::ostream::operator<<(this_00,reference);
      std::operator<<((ostream *)this_00,"; got ");
      std::ostream::operator<<(this_00,state.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
      }
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyFloat (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat> state;
	glGetFloatv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state != reference)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}